

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitInvoke(RegSlot location,RegSlot callObjLocation,PropertyId propertyId,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  bool bVar1;
  uint16 callSiteId;
  
  EmitMethodFld(false,false,location,callObjLocation,propertyId,byteCodeGenerator,funcInfo,true);
  FuncInfo::StartRecordingOutArgs(funcInfo,1);
  this = &byteCodeGenerator->m_writer;
  bVar1 = Js::ByteCodeWriter::ShouldIncrementCallSiteId(this,CallI);
  if ((bVar1) && (callSiteId = byteCodeGenerator->m_callSiteId, callSiteId != 0xffff)) {
    byteCodeGenerator->m_callSiteId = callSiteId + 1;
  }
  else {
    callSiteId = byteCodeGenerator->m_callSiteId;
  }
  Js::ByteCodeWriter::StartCall(this,StartCall,1);
  if (callObjLocation != 0xffffffff) {
    Js::ByteCodeWriter::ArgOut<true>(this,0,callObjLocation,callSiteId,false);
  }
  Js::ByteCodeWriter::CallI(this,CallI,location,location,1,callSiteId,CallFlags_None);
  return;
}

Assistant:

void EmitInvoke(
    Js::RegSlot location,
    Js::RegSlot callObjLocation,
    Js::PropertyId propertyId,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    EmitMethodFld(false, false, location, callObjLocation, propertyId, byteCodeGenerator, funcInfo);

    funcInfo->StartRecordingOutArgs(1);

    Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(Js::OpCode::CallI);

    byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, 1);
    EmitArgListStart(callObjLocation, byteCodeGenerator, funcInfo, callSiteId);

    byteCodeGenerator->Writer()->CallI(Js::OpCode::CallI, location, location, 1, callSiteId);
}